

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_float_convert.cpp
# Opt level: O1

float local_float_convert::get_random_float<float,_1,27>(void)

{
  result_type_conflict2 rVar1;
  result_type rVar2;
  float fVar3;
  float fVar4;
  
  if (get_random_float<float,-1,27>()::dist_man == '\0') {
    get_random_float<float,_1,27>();
  }
  if (get_random_float<float,-1,27>()::dist_sgn == '\0') {
    get_random_float<float,_1,27>();
  }
  if (get_random_float<float,-1,27>()::dist_e10 == '\0') {
    get_random_float<float,_1,27>();
  }
  engine_e10();
  rVar1 = std::uniform_int_distribution<int>::operator()
                    (&get_random_float<float,_-1,_27>::dist_e10,&engine_e10::my_engine_e10,
                     &get_random_float<float,_-1,_27>::dist_e10._M_param);
  fVar3 = powf(10.0,(float)rVar1);
  engine_man();
  fVar4 = std::
          generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    (&engine_man::my_engine_man);
  fVar3 = ((get_random_float<float,_-1,_27>::dist_man._M_param._M_b -
           get_random_float<float,_-1,_27>::dist_man._M_param._M_a) * fVar4 +
          get_random_float<float,_-1,_27>::dist_man._M_param._M_a) * fVar3;
  engine_sgn();
  rVar2 = std::uniform_int_distribution<unsigned_int>::operator()
                    (&get_random_float<float,_-1,_27>::dist_sgn,&engine_sgn::my_engine_sgn,
                     &get_random_float<float,_-1,_27>::dist_sgn._M_param);
  if (rVar2 != 0) {
    fVar3 = -fVar3;
  }
  return fVar3;
}

Assistant:

auto get_random_float() -> FloatingPointType
  {
    using local_builtin_float_type = FloatingPointType;

    static std::uniform_real_distribution<local_builtin_float_type>
    dist_man
    (
      static_cast<local_builtin_float_type>(0.0F),
      static_cast<local_builtin_float_type>(1.0F)
    );

    static auto dist_sgn = unsigned_dist_maker(static_cast<unsigned>(UINT8_C(0)),
                                               static_cast<unsigned>(UINT8_C(1)));

    static auto dist_e10 = unsigned_dist_maker(LoExp10, HiExp10);

    using std::pow;

    const auto p10 = dist_e10(engine_e10());

    const local_builtin_float_type e10 = pow(static_cast<local_builtin_float_type>(10.0F),
                                             static_cast<local_builtin_float_type>(p10));

    const local_builtin_float_type a = dist_man(engine_man()) * e10;

    const bool is_neg = (dist_sgn(engine_sgn()) != 0);

    const local_builtin_float_type f = ((!is_neg) ? a : -a);

    return f;
  }